

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

void reportIpmNoProgress(HighsOptions *options,Info *ipx_info)

{
  long in_RSI;
  long in_RDI;
  
  highsLogUser(*(HighsLogOptions **)(in_RSI + 0x70),(HighsLogType)(in_RDI + 0x380),(char *)0x4,
               "No progress: primal objective value       = %11.4g\n");
  highsLogUser(*(HighsLogOptions **)(in_RSI + 0x50),(HighsLogType)(in_RDI + 0x380),(char *)0x4,
               "No progress: max absolute primal residual = %11.4g\n");
  highsLogUser(*(HighsLogOptions **)(in_RSI + 0x58),(HighsLogType)(in_RDI + 0x380),(char *)0x4,
               "No progress: max absolute   dual residual = %11.4g\n");
  return;
}

Assistant:

void reportIpmNoProgress(const HighsOptions& options,
                         const ipx::Info& ipx_info) {
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: primal objective value       = %11.4g\n",
               ipx_info.pobjval);
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: max absolute primal residual = %11.4g\n",
               ipx_info.abs_presidual);
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: max absolute   dual residual = %11.4g\n",
               ipx_info.abs_dresidual);
}